

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallExportGenerator::TempDirCalculate_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view input;
  cmCryptoHash hasher;
  cmCryptoHash cStack_58;
  string local_48;
  char *local_28;
  undefined8 local_20;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  local_48._M_string_length = (size_type)(psVar1->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)psVar1->_M_string_length;
  local_48.field_2._M_allocated_capacity = 0;
  local_48.field_2._8_8_ = 0x12;
  local_28 = "/CMakeFiles/Export";
  local_20 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_48;
  cmCatViews(__return_storage_ptr__,views);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    cmCryptoHash::cmCryptoHash(&cStack_58,AlgoMD5);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    input._M_str = (this->super_cmInstallGenerator).Destination._M_dataplus._M_p;
    input._M_len = (this->super_cmInstallGenerator).Destination._M_string_length;
    cmCryptoHash::HashString_abi_cxx11_(&local_48,&cStack_58,input);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    cmCryptoHash::~cmCryptoHash(&cStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::TempDirCalculate() const
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  std::string path = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), "/CMakeFiles/Export");
  if (this->Destination.empty()) {
    return path;
  }

  cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
  path += '/';
  // Replace the destination path with a hash to keep it short.
  path += hasher.HashString(this->Destination);

  return path;
}